

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomFont::write(DomFont *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  char16_t *pcVar2;
  uint uVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  char16_t *pcVar6;
  long in_FS_OFFSET;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  QAnyStringView QVar25;
  QAnyStringView QVar26;
  QAnyStringView QVar27;
  QAnyStringView QVar28;
  QAnyStringView QVar29;
  QAnyStringView QVar30;
  QAnyStringView QVar31;
  size_t sStack_90;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  aVar5._4_4_ = in_register_00000034;
  aVar5._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_50.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_50.ptr = L"font";
    local_68.size = 0;
    local_50.size = 4;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar19.m_size = (size_t)local_50.ptr;
  QVar19.field_0.m_data = aVar5.m_data;
  QXmlStreamWriter::writeStartElement(QVar19);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  uVar3 = this->m_children;
  if ((uVar3 & 1) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"family",6);
    QVar7.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    QVar7.m_size = (size_t)(this->m_family).d.ptr;
    QVar20.m_size = (size_t)local_50.ptr;
    QVar20.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeTextElement(QVar20,QVar7);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 2) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"pointsize",9);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_pointSize);
    QVar8.m_size = (size_t)local_80.ptr;
    QVar8.field_0.m_data = aVar4.m_data;
    QVar21.m_size = (size_t)pcVar2;
    QVar21.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeTextElement(QVar21,QVar8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 4) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"weight",6);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_weight);
    QVar9.m_size = (size_t)local_80.ptr;
    QVar9.field_0.m_data = aVar4.m_data;
    QVar22.m_size = (size_t)pcVar2;
    QVar22.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeTextElement(QVar22,QVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 8) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"italic",6);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    if (this->m_italic == true) {
      pcVar6 = L"true";
      sStack_90 = 4;
    }
    else {
      pcVar6 = L"false";
      sStack_90 = 5;
    }
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,pcVar6,sStack_90);
    QVar10.m_size = (size_t)local_80.ptr;
    QVar10.field_0.m_data = aVar4.m_data;
    QVar23.m_size = (size_t)pcVar2;
    QVar23.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeTextElement(QVar23,QVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 0x10) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"bold",4);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    if (this->m_bold == true) {
      pcVar6 = L"true";
      sStack_90 = 4;
    }
    else {
      pcVar6 = L"false";
      sStack_90 = 5;
    }
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,pcVar6,sStack_90);
    QVar11.m_size = (size_t)local_80.ptr;
    QVar11.field_0.m_data = aVar4.m_data;
    QVar24.m_size = (size_t)pcVar2;
    QVar24.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeTextElement(QVar24,QVar11);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 0x20) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"underline",9);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    if (this->m_underline == true) {
      pcVar6 = L"true";
      sStack_90 = 4;
    }
    else {
      pcVar6 = L"false";
      sStack_90 = 5;
    }
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,pcVar6,sStack_90);
    QVar12.m_size = (size_t)local_80.ptr;
    QVar12.field_0.m_data = aVar4.m_data;
    QVar25.m_size = (size_t)pcVar2;
    QVar25.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeTextElement(QVar25,QVar12);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 0x40) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"strikeout",9);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    if (this->m_strikeOut == true) {
      pcVar6 = L"true";
      sStack_90 = 4;
    }
    else {
      pcVar6 = L"false";
      sStack_90 = 5;
    }
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,pcVar6,sStack_90);
    QVar13.m_size = (size_t)local_80.ptr;
    QVar13.field_0.m_data = aVar4.m_data;
    QVar26.m_size = (size_t)pcVar2;
    QVar26.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeTextElement(QVar26,QVar13);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((char)uVar3 < '\0') {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"antialiasing",0xc);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    if (this->m_antialiasing == true) {
      pcVar6 = L"true";
      sStack_90 = 4;
    }
    else {
      pcVar6 = L"false";
      sStack_90 = 5;
    }
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,pcVar6,sStack_90);
    QVar14.m_size = (size_t)local_80.ptr;
    QVar14.field_0.m_data = aVar4.m_data;
    QVar27.m_size = (size_t)pcVar2;
    QVar27.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeTextElement(QVar27,QVar14);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 >> 8 & 1) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"stylestrategy",0xd);
    QVar15.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    QVar15.m_size = (size_t)(this->m_styleStrategy).d.ptr;
    QVar28.m_size = (size_t)local_50.ptr;
    QVar28.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeTextElement(QVar28,QVar15);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 >> 9 & 1) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"kerning",7);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    if (this->m_kerning == true) {
      pcVar6 = L"true";
      sStack_90 = 4;
    }
    else {
      pcVar6 = L"false";
      sStack_90 = 5;
    }
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,pcVar6,sStack_90);
    QVar16.m_size = (size_t)local_80.ptr;
    QVar16.field_0.m_data = aVar4.m_data;
    QVar29.m_size = (size_t)pcVar2;
    QVar29.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeTextElement(QVar29,QVar16);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 >> 10 & 1) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"hintingpreference",0x11);
    QVar17.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    QVar17.m_size = (size_t)(this->m_hintingPreference).d.ptr;
    QVar30.m_size = (size_t)local_50.ptr;
    QVar30.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeTextElement(QVar30,QVar17);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 >> 0xb & 1) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"fontweight",10);
    QVar18.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    QVar18.m_size = (size_t)(this->m_fontWeight).d.ptr;
    QVar31.m_size = (size_t)local_50.ptr;
    QVar31.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeTextElement(QVar31,QVar18);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomFont::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("font") : tagName.toLower());

    if (m_children & Family)
        writer.writeTextElement(u"family"_s, m_family);

    if (m_children & PointSize)
        writer.writeTextElement(u"pointsize"_s, QString::number(m_pointSize));

    if (m_children & Weight)
        writer.writeTextElement(u"weight"_s, QString::number(m_weight));

    if (m_children & Italic)
        writer.writeTextElement(u"italic"_s, (m_italic ? u"true"_s : u"false"_s));

    if (m_children & Bold)
        writer.writeTextElement(u"bold"_s, (m_bold ? u"true"_s : u"false"_s));

    if (m_children & Underline)
        writer.writeTextElement(u"underline"_s, (m_underline ? u"true"_s : u"false"_s));

    if (m_children & StrikeOut)
        writer.writeTextElement(u"strikeout"_s, (m_strikeOut ? u"true"_s : u"false"_s));

    if (m_children & Antialiasing)
        writer.writeTextElement(u"antialiasing"_s, (m_antialiasing ? u"true"_s : u"false"_s));

    if (m_children & StyleStrategy)
        writer.writeTextElement(u"stylestrategy"_s, m_styleStrategy);

    if (m_children & Kerning)
        writer.writeTextElement(u"kerning"_s, (m_kerning ? u"true"_s : u"false"_s));

    if (m_children & HintingPreference)
        writer.writeTextElement(u"hintingpreference"_s, m_hintingPreference);

    if (m_children & FontWeight)
        writer.writeTextElement(u"fontweight"_s, m_fontWeight);

    writer.writeEndElement();
}